

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
DeleteProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *this_00;
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  uint uVar3;
  PropertyOperationFlags PVar4;
  bool bVar5;
  uint32 index;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_01;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *pSVar9;
  Type *pTVar10;
  byte bVar11;
  ScriptContext *this_02;
  PropertyRecord *local_48;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_40;
  undefined4 *local_38;
  
  while (bVar11 = (this->super_DynamicTypeHandler).flags, (bVar11 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  if ((DAT_0145c35c == '\x01') && ((this->field_0x28 & 6) == 0)) {
    pSVar9 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                          *)this,instance)->
              super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>;
    BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
            DeleteProperty_Internal<false>(pSVar9,instance,propertyId,propertyOperationFlags);
    return BVar6;
  }
  local_38 = (undefined4 *)CONCAT44(local_38._4_4_,propertyOperationFlags);
  pTVar10 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar10[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar11 & 0x10) != 0) || (*(char *)((long)&pTVar10[1].javascriptLibrary.ptr + 1) == '\x01')
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar5) goto LAB_00c79b20;
      *puVar7 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar10 = (instance->super_RecyclableObject).type.ptr;
  }
  this_00 = (((pTVar10->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_02 = this_00;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) goto LAB_00c79b20;
    *puVar7 = 0;
    this_02 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_48 = ScriptContext::GetPropertyName(this_02,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,&local_40);
  uVar3 = DAT_0145c358;
  if (bVar5) {
    BVar6 = 1;
    if ((local_40->Attributes & 0x18) == 0) {
      if ((local_40->Attributes & 2) == 0) {
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  ((PropertyOperationFlags)local_38,this_00,(PCWSTR)(local_48 + 1));
        BVar6 = 0;
      }
      else {
        if (local_40->propertyIndex != 0xffff) {
          pRVar8 = (((this_00->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
          if ((0 < (int)DAT_0145c358 && (this->field_0x28 & 2) == 0) &&
             (bVar11 = this->numDeletedProperties + 1, this->numDeletedProperties = bVar11,
             uVar3 <= bVar11)) {
            if (((this->field_0x28 & 4) == 0) &&
               (pRVar8 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                   (&instance->super_RecyclableObject,(RecyclableObject **)0x0),
               pRVar8 == (RecyclableObject *)0x0)) {
              bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
              PVar4 = (PropertyOperationFlags)local_38;
              if (bVar5) {
                Output::Print(
                             L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"
                             );
                Output::Flush();
              }
              pSVar9 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                        ::
                        ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                                  ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                                    *)this,instance)->
                        super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
              ;
              BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                      ::DeleteProperty_Internal<false>(pSVar9,instance,propertyId,PVar4);
              return BVar6;
            }
            bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
            PVar4 = (PropertyOperationFlags)local_38;
            if (bVar5) {
              Output::Print(
                           L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                           );
              Output::Flush();
            }
            this_01 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                       ::
                       ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>
                                 ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                                   *)this,instance)->
                       super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
            ;
            BVar6 = DeleteProperty_Internal<false>(this_01,instance,propertyId,PVar4);
            return BVar6;
          }
          pRVar1 = (this->singletonInstance).ptr;
          if ((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
             ((DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef != instance)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *local_38 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x6f4,
                                        "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                        ,
                                        "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                       );
            if (!bVar5) {
LAB_00c79b20:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *local_38 = 0;
          }
          SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
          InvalidateFixedField<Js::PropertyRecord_const*>
                    ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                      *)this,local_48,local_40,
                     (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr);
          if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
            ScriptContext::InvalidateProtoCaches(this_00,propertyId);
          }
          if (((this->field_0x28 & 2) == 0) ||
             (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                      ::TryRegisterDeletedPropertyIndex
                                ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                                  *)this,instance,local_40->propertyIndex), !bVar5)) {
            DynamicTypeHandler::SetSlotUnchecked(instance,(uint)local_40->propertyIndex,pRVar8);
          }
        }
        local_40->Attributes = '\x0e';
        if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
          DynamicObject::ChangeType(instance);
        }
        DynamicTypeHandler::SetPropertyUpdateSideEffect
                  (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
      }
    }
  }
  else {
    bVar5 = DynamicObject::HasObjectArray(instance);
    if ((bVar5) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar6 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,
                         (PropertyOperationFlags)local_38);
    }
    else {
      BVar6 = 1;
    }
  }
  return BVar6;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }